

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blockchain.cpp
# Opt level: O3

void __thiscall Blockchain::Blockchain(Blockchain *this)

{
  string local_f8;
  string local_d8;
  Block local_b8;
  
  this->_bIndex = 1;
  (this->_bChain).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_bChain).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_bChain).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Genesis Block","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,anon_var_dwarf_3a619 + 0xc);
  Block::Block(&local_b8,1,&local_d8,&local_f8);
  std::vector<Block,_std::allocator<Block>_>::emplace_back<Block>(&this->_bChain,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._bData._M_dataplus._M_p != &local_b8._bData.field_2) {
    operator_delete(local_b8._bData._M_dataplus._M_p,
                    local_b8._bData.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.merkle_root._M_dataplus._M_p != &local_b8.merkle_root.field_2) {
    operator_delete(local_b8.merkle_root._M_dataplus._M_p,
                    local_b8.merkle_root.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._bHash._M_dataplus._M_p != &local_b8._bHash.field_2) {
    operator_delete(local_b8._bHash._M_dataplus._M_p,
                    local_b8._bHash.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.bPrevHash._M_dataplus._M_p != &local_b8.bPrevHash.field_2) {
    operator_delete(local_b8.bPrevHash._M_dataplus._M_p,
                    local_b8.bPrevHash.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Blockchain::Blockchain()
{
	_bChain.emplace_back(Block(_bIndex,"Genesis Block", ""));
}